

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

ArrayPtr<const_unsigned_char> * __thiscall
kj::Vector<kj::ArrayPtr<unsigned_char_const>>::add<kj::ArrayPtr<unsigned_char_const>>
          (Vector<kj::ArrayPtr<unsigned_char_const>> *this,ArrayPtr<const_unsigned_char> *params)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  size_t sVar2;
  undefined8 *puVar3;
  
  puVar3 = *(undefined8 **)(this + 8);
  if (puVar3 == *(undefined8 **)(this + 0x10)) {
    Vector<kj::ArrayPtr<const_unsigned_char>_>::grow
              ((Vector<kj::ArrayPtr<const_unsigned_char>_> *)this,0);
    puVar3 = *(undefined8 **)(this + 8);
  }
  sVar2 = params->size_;
  *puVar3 = params->ptr;
  puVar3[1] = sVar2;
  pAVar1 = *(ArrayPtr<const_unsigned_char> **)(this + 8);
  *(ArrayPtr<const_unsigned_char> **)(this + 8) = pAVar1 + 1;
  return pAVar1;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }